

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

void __thiscall
QHashPrivate::Node<QDBusSlotCache::Key,QDBusSlotCache::Data>::
emplaceValue<QDBusSlotCache::Data_const&>
          (Node<QDBusSlotCache::Key,_QDBusSlotCache::Data> *this,Data *args)

{
  Data *in_RDI;
  long in_FS_OFFSET;
  Data *this_00;
  Data local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &local_28;
  QDBusSlotCache::Data::Data(this_00,in_RDI);
  QDBusSlotCache::Data::operator=(this_00,in_RDI);
  QDBusSlotCache::Data::~Data((Data *)0x187e89);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplaceValue(Args &&... args)
    {
        value = T(std::forward<Args>(args)...);
    }